

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O0

_InstInfo * inst_lookup_prefixed(_InstNode in,_PrefixState *ps)

{
  bool bVar1;
  uint uVar2;
  uint *in_RSI;
  _InstNode in_DI;
  _InstInfo *ii;
  int index;
  int checkOpSize;
  _InstInfo *local_28;
  int local_20;
  _InstInfo *local_8;
  
  bVar1 = false;
  local_20 = 0;
  uVar2 = *in_RSI & 0x2060;
  if (uVar2 == 0) {
    local_20 = 0;
  }
  else if (uVar2 == 0x20) {
    local_20 = 3;
    *in_RSI = *in_RSI & 0xffffffdf;
  }
  else if (uVar2 == 0x40) {
    local_20 = 2;
    *in_RSI = *in_RSI & 0xffffffbf;
  }
  else if (uVar2 == 0x2000) {
    local_20 = 1;
    in_RSI[7] = 1;
    *in_RSI = *in_RSI & 0xffffdfff;
  }
  else {
    if ((*in_RSI & 0x60) == 0x60) {
      return (_InstInfo *)0x0;
    }
    if ((*in_RSI & 0x20) == 0) {
      if ((*in_RSI & 0x40) != 0) {
        local_20 = 2;
        *in_RSI = *in_RSI & 0xffffffbf;
      }
    }
    else {
      local_20 = 3;
      *in_RSI = *in_RSI & 0xffffffdf;
    }
    bVar1 = true;
  }
  local_28 = inst_get_info(in_DI,local_20);
  if ((bVar1) &&
     ((local_28 == (_InstInfo *)0x0 ||
      (((FlagsTable[InstSharedInfoTable[local_28->sharedIndex].flagsIndex] ^ 0xffffffff) & 0x2000)
       != 0)))) {
    local_8 = (_InstInfo *)0x0;
  }
  else {
    if (local_28 == (_InstInfo *)0x0) {
      local_28 = inst_get_info(in_DI,0);
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static _InstInfo* inst_lookup_prefixed(_InstNode in, _PrefixState* ps)
{
	int checkOpSize = FALSE;
	int index = 0;
	_InstInfo* ii = NULL;

	/* Check prefixes of current decoded instruction (None, 0x66, 0xf3, 0xf2). */
	switch (ps->decodedPrefixes & (INST_PRE_OP_SIZE | INST_PRE_REPS))
	{
		case 0:
			/* Non-prefixed, index = 0. */
			index = 0;
		break;
		case INST_PRE_OP_SIZE:
			/* 0x66, index = 1. */
			index = 1;
			/* Mark that we used it as a mandatory prefix. */
			ps->isOpSizeMandatory = TRUE;
			ps->decodedPrefixes &= ~INST_PRE_OP_SIZE;
		break;
		case INST_PRE_REP:
			/* 0xf3, index = 2. */
			index = 2;
			ps->decodedPrefixes &= ~INST_PRE_REP;
		break;
		case INST_PRE_REPNZ:
			/* 0xf2, index = 3. */
			index = 3;
			ps->decodedPrefixes &= ~INST_PRE_REPNZ;
		break;
		default:
			/*
			 * Now we got a problem, since there are a few mandatory prefixes at once.
			 * There is only one case when it's ok, when the operand size prefix is for real (not mandatory).
			 * Otherwise we will have to return NULL, since the instruction is illegal.
			 * Therefore we will start with REPNZ and REP prefixes,
			 * try to get the instruction and only then check for the operand size prefix.
			 */

			 /* If both REPNZ and REP are together, it's illegal for sure. */
			if ((ps->decodedPrefixes & INST_PRE_REPS) == INST_PRE_REPS) return NULL;

			/* Now we know it's either REPNZ+OPSIZE or REP+OPSIZE, so examine the instruction. */
			if (ps->decodedPrefixes & INST_PRE_REPNZ) {
				index = 3;
				ps->decodedPrefixes &= ~INST_PRE_REPNZ;
			}
			else if (ps->decodedPrefixes & INST_PRE_REP) {
				index = 2;
				ps->decodedPrefixes &= ~INST_PRE_REP;
			}
			/* Mark to verify the operand-size prefix of the fetched instruction below. */
			checkOpSize = TRUE;
		break;
	}

	/* Fetch the inst-info from the index. */
	ii = inst_get_info(in, index);

	if (checkOpSize) {
		/* If the instruction doesn't support operand size prefix, then it's illegal. */
		if ((ii == NULL) || (~INST_INFO_FLAGS(ii) & INST_PRE_OP_SIZE)) return NULL;
	}

	/* If there was a prefix, but the instruction wasn't found. Try to fall back to use the normal instruction. */
	if (ii == NULL) ii = inst_get_info(in, 0);
	return ii;
}